

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ParsedParameterVector *
pbrt::
parseParameters<std::function<pstd::optional<pbrt::Token>(int)>,pbrt::parse(pbrt::ParserTarget*,std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>)::__6>
          (function<pstd::optional<pbrt::Token>_(int)> *nextToken,anon_class_8_1_6da50f9a ungetToken
          ,bool formatting,function<void_(const_pbrt::Token_&,_const_char_*)> *errorCallback)

{
  char **ppcVar1;
  Token t_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  FileLoc loc;
  bool bVar2;
  Token *pTVar3;
  string *psVar4;
  const_iterator pvVar5;
  const_iterator pvVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  iterator pbVar7;
  byte in_CL;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  undefined8 in_R8;
  string_view sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  Token val;
  anon_class_24_3_4da73ed2 addVal;
  ValType valType;
  const_iterator nameEnd;
  const_iterator nameBegin;
  const_iterator typeEnd;
  const_iterator typeBegin;
  anon_class_8_1_898aa9a8 skipToSpace;
  anon_class_8_1_898aa9a8 skipSpace;
  string_view decl;
  ParsedParameter *param;
  optional<pbrt::Token> t;
  ParsedParameterVector *parameterVector;
  char *in_stack_fffffffffffffc68;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffc70;
  allocator<char> *__a;
  undefined4 in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  function<pstd::optional<pbrt::Token>_(int)> *in_stack_fffffffffffffc88;
  iterator in_stack_fffffffffffffc90;
  Token *in_stack_fffffffffffffc98;
  Token *in_stack_fffffffffffffca0;
  const_iterator in_stack_fffffffffffffca8;
  FileLoc *in_stack_fffffffffffffcb0;
  FileLoc *loc_00;
  Token *in_stack_fffffffffffffcd8;
  ParsedParameter *in_stack_fffffffffffffcf0;
  size_t in_stack_fffffffffffffd00;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  Token *in_stack_fffffffffffffd08;
  anon_class_24_3_4da73ed2 *in_stack_fffffffffffffd10;
  iterator local_260;
  undefined1 local_1b0 [40];
  undefined4 *local_188;
  undefined8 local_180;
  string **local_178;
  undefined4 local_16c;
  const_iterator local_168;
  const_iterator local_138;
  ParsedParameter *local_130;
  const_iterator local_100;
  basic_string_view<char,_std::char_traits<char>_> *local_f8;
  basic_string_view<char,_std::char_traits<char>_> *local_f0;
  string_view local_e8;
  char *local_d8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_d0;
  allocator<char> *local_c8;
  string *local_c0;
  char *local_b8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_b0;
  size_t sStack_a8;
  char *pcStack_a0;
  function<pstd::optional<pbrt::Token>_(int)> *local_98;
  size_t local_88;
  char *local_80;
  int local_78;
  optional<pbrt::Token> local_68;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_38;
  byte local_29;
  undefined8 local_28;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_29 = 0;
  local_28 = in_R8;
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            (&in_stack_fffffffffffffc70->alloc);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_RDI,&local_38);
  do {
    std::function<pstd::optional<pbrt::Token>_(int)>::operator()
              (in_stack_fffffffffffffc88,in_stack_fffffffffffffc84);
    bVar2 = pstd::optional<pbrt::Token>::has_value(&local_68);
    if (bVar2) {
      pTVar3 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x758bb1);
      local_88 = (pTVar3->token)._M_len;
      local_80 = (pTVar3->token)._M_str;
      sVar8._M_str = (char *)in_stack_fffffffffffffc70;
      sVar8._M_len = (size_t)in_stack_fffffffffffffc68;
      bVar2 = isQuotedString(sVar8);
      if (bVar2) {
        psVar4 = (string *)operator_new(0xf0);
        pTVar3 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x758caf);
        __a = *(allocator<char> **)&(pTVar3->loc).line;
        in_stack_fffffffffffffc68 = (char *)(pTVar3->loc).filename._M_len;
        in_stack_fffffffffffffc70 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar3->loc).filename._M_str;
        loc.filename._M_str = (char *)in_stack_fffffffffffffd08;
        loc.filename._M_len = in_stack_fffffffffffffd00;
        loc._16_8_ = in_stack_fffffffffffffd10;
        local_d8 = in_stack_fffffffffffffc68;
        pIStack_d0 = in_stack_fffffffffffffc70;
        local_c8 = __a;
        ParsedParameter::ParsedParameter(in_stack_fffffffffffffcf0,loc);
        local_c0 = psVar4;
        pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x758d23);
        sVar8 = dequoteString(in_stack_fffffffffffffcd8);
        local_f8 = &local_e8;
        local_f0 = local_f8;
        local_e8 = sVar8;
        std::basic_string_view<char,_std::char_traits<char>_>::begin(local_f8);
        pvVar5 = parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/parser.cpp:658:18)>
                 ::anon_class_8_1_898aa9a8::operator()
                           ((anon_class_8_1_898aa9a8 *)in_stack_fffffffffffffc90,
                            (const_iterator)in_stack_fffffffffffffc88);
        local_100 = pvVar5;
        pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::end(&local_e8);
        if (pvVar5 == pvVar6) {
          pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x758df1);
          this_00 = &local_e8;
          std::basic_string_view<char,_std::char_traits<char>_>::begin(this_00);
          std::basic_string_view<char,_std::char_traits<char>_>::end(this_00);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    (in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                     (char *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),__a);
          ErrorExit<std::__cxx11::string>
                    (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffca0);
        }
        in_stack_fffffffffffffcf0 =
             (ParsedParameter *)
             parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/parser.cpp:658:18)>
             ::anon_class_8_1_898aa9a8::operator()
                       ((anon_class_8_1_898aa9a8 *)
                        CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                        (const_iterator)__a);
        local_130 = in_stack_fffffffffffffcf0;
        std::__cxx11::string::assign<char_const*,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,
                   (char *)in_stack_fffffffffffffc90);
        if ((local_19 & 1) != 0) {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          if (bVar2) {
            std::__cxx11::string::operator=(local_c0,"point3");
          }
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          if (bVar2) {
            std::__cxx11::string::operator=(local_c0,"vector3");
          }
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          if (bVar2) {
            std::__cxx11::string::operator=(local_c0,"rgb");
          }
        }
        pvVar5 = parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/parser.cpp:658:18)>
                 ::anon_class_8_1_898aa9a8::operator()
                           ((anon_class_8_1_898aa9a8 *)in_stack_fffffffffffffc90,
                            (const_iterator)in_stack_fffffffffffffc88);
        local_138 = pvVar5;
        pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::end(&local_e8);
        if (pvVar5 == pvVar6) {
          pTVar3 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x75906a);
          loc_00 = &pTVar3->loc;
          std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_e8);
          std::basic_string_view<char,_std::char_traits<char>_>::end(&local_e8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    (in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                     (char *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),__a);
          ErrorExit<std::__cxx11::string>
                    (loc_00,in_stack_fffffffffffffca8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffca0);
        }
        in_stack_fffffffffffffca8 =
             parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/parser.cpp:658:18)>
             ::anon_class_8_1_898aa9a8::operator()
                       ((anon_class_8_1_898aa9a8 *)
                        CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                        (const_iterator)__a);
        local_168 = in_stack_fffffffffffffca8;
        std::__cxx11::string::assign<char_const*,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,
                   (char *)in_stack_fffffffffffffc90);
        local_16c = 0;
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        if (bVar2) {
          local_16c = 4;
        }
        local_188 = &local_16c;
        local_180 = local_28;
        local_178 = &local_c0;
        std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                  (in_stack_fffffffffffffc88,in_stack_fffffffffffffc84);
        in_stack_fffffffffffffca0 =
             pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x75920e);
        memcpy(local_1b0,in_stack_fffffffffffffca0,0x28);
        pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x759239);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),(char *)__a);
        __x._M_str = (char *)in_stack_fffffffffffffca0;
        __x._M_len = (size_t)in_stack_fffffffffffffc98;
        __y._M_str = (char *)in_stack_fffffffffffffc90;
        __y._M_len = (size_t)in_stack_fffffffffffffc88;
        bVar2 = std::operator==(__x,__y);
        if (bVar2) {
          while( true ) {
            std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                      (in_stack_fffffffffffffc88,in_stack_fffffffffffffc84);
            in_stack_fffffffffffffc98 =
                 pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x7592c8);
            memcpy(local_1b0,in_stack_fffffffffffffc98,0x28);
            pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x7592f3);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),(char *)__a);
            __x_00._M_str = (char *)in_stack_fffffffffffffca0;
            __x_00._M_len = (size_t)in_stack_fffffffffffffc98;
            __y_00._M_str = (char *)in_stack_fffffffffffffc90;
            __y_00._M_len = (size_t)in_stack_fffffffffffffc88;
            bVar2 = std::operator==(__x_00,__y_00);
            if (bVar2) break;
            parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/parser.cpp:658:18)>
            ::anon_class_24_3_4da73ed2::operator()
                      (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
          }
        }
        else {
          parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/parser.cpp:658:18)>
          ::anon_class_24_3_4da73ed2::operator()
                    (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        }
        if ((local_19 & 1) != 0) {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          if (bVar2) {
            this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_c0 + 0x98);
            local_260 = pstd::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::begin(this);
            pbVar7 = pstd::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(this);
            in_stack_fffffffffffffc90 = pbVar7;
            for (; local_260 != pbVar7; local_260 = local_260 + 1) {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
              if (bVar2) {
                pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
                push_back((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *
                          )CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                          (uchar *)__a);
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
                if (bVar2) {
                  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
                  push_back((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>
                             *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                            (uchar *)__a);
                }
                else {
                  Error<std::__cxx11::string_const&>
                            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffca0);
                }
              }
            }
            pstd::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffc70);
          }
        }
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::push_back((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                     *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                    (ParsedParameter **)__a);
        local_78 = 0;
      }
      else {
        pTVar3 = pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x758c04);
        in_stack_fffffffffffffc88 =
             *(function<pstd::optional<pbrt::Token>_(int)> **)&(pTVar3->loc).line;
        in_stack_fffffffffffffc68 = (char *)(pTVar3->token)._M_len;
        in_stack_fffffffffffffc70 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar3->token)._M_str;
        sStack_a8 = (pTVar3->loc).filename._M_len;
        ppcVar1 = &(pTVar3->loc).filename._M_str;
        pcStack_a0 = *ppcVar1;
        in_stack_fffffffffffffc80 = SUB84(pcStack_a0,0);
        in_stack_fffffffffffffc84 = (int)((ulong)pcStack_a0 >> 0x20);
        t_00.loc.filename._M_len = (size_t)in_stack_fffffffffffffc90;
        t_00.token = (string_view)*(undefined1 (*) [16])ppcVar1;
        t_00.loc.filename._M_str = (char *)in_stack_fffffffffffffc98;
        t_00.loc._16_8_ = in_stack_fffffffffffffca0;
        local_b8 = in_stack_fffffffffffffc68;
        pIStack_b0 = in_stack_fffffffffffffc70;
        local_98 = in_stack_fffffffffffffc88;
        parse::anon_class_8_1_6da50f9a::operator()
                  ((anon_class_8_1_6da50f9a *)in_stack_fffffffffffffc70,t_00);
        local_29 = 1;
        local_78 = 1;
      }
    }
    else {
      local_29 = 1;
      local_78 = 1;
    }
    pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x759580);
    if (local_78 != 0) {
      if ((local_29 & 1) == 0) {
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::~InlinedVector(in_stack_fffffffffffffc70);
      }
      return in_RDI;
    }
  } while( true );
}

Assistant:

static ParsedParameterVector parseParameters(
    Next nextToken, Unget ungetToken, bool formatting,
    const std::function<void(const Token &token, const char *)> &errorCallback) {
    ParsedParameterVector parameterVector;

    while (true) {
        pstd::optional<Token> t = nextToken(TokenOptional);
        if (!t.has_value())
            return parameterVector;

        if (!isQuotedString(t->token)) {
            ungetToken(*t);
            return parameterVector;
        }

        ParsedParameter *param = new ParsedParameter(t->loc);

        std::string_view decl = dequoteString(*t);

        auto skipSpace = [&decl](std::string_view::const_iterator iter) {
            while (iter != decl.end() && (*iter == ' ' || *iter == '\t'))
                ++iter;
            return iter;
        };
        // Skip to the next whitespace character (or the end of the string).
        auto skipToSpace = [&decl](std::string_view::const_iterator iter) {
            while (iter != decl.end() && *iter != ' ' && *iter != '\t')
                ++iter;
            return iter;
        };

        auto typeBegin = skipSpace(decl.begin());
        if (typeBegin == decl.end())
            ErrorExit(&t->loc, "Parameter \"%s\" doesn't have a type declaration?!",
                      std::string(decl.begin(), decl.end()));

        // Find end of type declaration
        auto typeEnd = skipToSpace(typeBegin);
        param->type.assign(typeBegin, typeEnd);

        if (formatting) {  // close enough: upgrade...
            if (param->type == "point")
                param->type = "point3";
            if (param->type == "vector")
                param->type = "vector3";
            if (param->type == "color")
                param->type = "rgb";
        }

        auto nameBegin = skipSpace(typeEnd);
        if (nameBegin == decl.end())
            ErrorExit(&t->loc, "Unable to find parameter name from \"%s\"",
                      std::string(decl.begin(), decl.end()));

        auto nameEnd = skipToSpace(nameBegin);
        param->name.assign(nameBegin, nameEnd);

        enum ValType { Unknown, String, Bool, Float, Int } valType = Unknown;

        if (param->type == "integer")
            valType = Int;

        auto addVal = [&](const Token &t) {
            if (isQuotedString(t.token)) {
                switch (valType) {
                case Unknown:
                    valType = String;
                    break;
                case String:
                    break;
                case Float:
                    errorCallback(t, "expected floating-point value");
                case Int:
                    errorCallback(t, "expected integer value");
                case Bool:
                    errorCallback(t, "expected Boolean value");
                }

                param->AddString(dequoteString(t));
            } else if (t.token[0] == 't' && t.token == "true") {
                switch (valType) {
                case Unknown:
                    valType = Bool;
                    break;
                case String:
                    errorCallback(t, "expected string value");
                case Float:
                    errorCallback(t, "expected floating-point value");
                case Int:
                    errorCallback(t, "expected integer value");
                case Bool:
                    break;
                }

                param->AddBool(true);
            } else if (t.token[0] == 'f' && t.token == "false") {
                switch (valType) {
                case Unknown:
                    valType = Bool;
                    break;
                case String:
                    errorCallback(t, "expected string value");
                case Float:
                    errorCallback(t, "expected floating-point value");
                case Int:
                    errorCallback(t, "expected integer value");
                case Bool:
                    break;
                }

                param->AddBool(false);
            } else {
                switch (valType) {
                case Unknown:
                    valType = Float;
                    break;
                case String:
                    errorCallback(t, "expected string value");
                case Float:
                    break;
                case Int:
                    break;
                case Bool:
                    errorCallback(t, "expected Boolean value");
                }

                if (valType == Int)
                    param->AddInt(parseInt(t));
                else
                    param->AddFloat(parseFloat(t));
            }
        };

        Token val = *nextToken(TokenRequired);

        if (val.token == "[") {
            while (true) {
                val = *nextToken(TokenRequired);
                if (val.token == "]")
                    break;
                addVal(val);
            }
        } else {
            addVal(val);
        }

        if (formatting && param->type == "bool") {
            for (const auto &b : param->strings) {
                if (b == "true")
                    param->bools.push_back(true);
                else if (b == "false")
                    param->bools.push_back(false);
                else
                    Error(&param->loc,
                          "%s: neither \"true\" nor \"false\" in bool "
                          "parameter list.",
                          b);
            }
            param->strings.clear();
        }

        parameterVector.push_back(param);
    }

    return parameterVector;
}